

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fUniformApiTests.cpp
# Opt level: O0

string * __thiscall
deqp::gles2::Functional::apiVarValueStr_abi_cxx11_
          (string *__return_storage_ptr__,Functional *this,VarValue *value)

{
  bool bVar1;
  int extraout_EDX;
  int extraout_EDX_00;
  int precision;
  char *pcVar2;
  string local_1e8;
  string local_1c8;
  int local_1a8;
  int i;
  undefined1 local_198 [8];
  ostringstream result;
  int numElems;
  VarValue *value_local;
  
  result._372_4_ = glu::getDataTypeScalarSize(*(DataType *)this);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
  if (1 < (int)result._372_4_) {
    std::operator<<((ostream *)local_198,"(");
  }
  for (local_1a8 = 0; local_1a8 < (int)result._372_4_; local_1a8 = local_1a8 + 1) {
    if (0 < local_1a8) {
      std::operator<<((ostream *)local_198,", ");
    }
    bVar1 = glu::isDataTypeFloatOrVec(*(DataType *)this);
    precision = extraout_EDX;
    if ((bVar1) ||
       (bVar1 = glu::isDataTypeMatrix(*(DataType *)this), precision = extraout_EDX_00, bVar1)) {
      de::floatToString_abi_cxx11_
                (&local_1c8,(de *)0x2,*(float *)(this + (long)local_1a8 * 4 + 4),precision);
      std::operator<<((ostream *)local_198,(string *)&local_1c8);
      std::__cxx11::string::~string((string *)&local_1c8);
    }
    else {
      bVar1 = glu::isDataTypeIntOrIVec(*(DataType *)this);
      if (bVar1) {
        de::toString<int>(&local_1e8,(int *)(this + (long)local_1a8 * 4 + 4));
        std::operator<<((ostream *)local_198,(string *)&local_1e8);
        std::__cxx11::string::~string((string *)&local_1e8);
      }
      else {
        bVar1 = glu::isDataTypeBoolOrBVec(*(DataType *)this);
        if (bVar1) {
          pcVar2 = "false";
          if (((byte)this[(long)local_1a8 + 4] & 1) != 0) {
            pcVar2 = "true";
          }
          std::operator<<((ostream *)local_198,pcVar2);
        }
        else {
          bVar1 = glu::isDataTypeSampler(*(DataType *)this);
          if (bVar1) {
            std::ostream::operator<<(local_198,*(int *)(this + 4));
          }
        }
      }
    }
  }
  if (1 < (int)result._372_4_) {
    std::operator<<((ostream *)local_198,")");
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
  return __return_storage_ptr__;
}

Assistant:

static string apiVarValueStr (const VarValue& value)
{
	const int			numElems = glu::getDataTypeScalarSize(value.type);
	std::ostringstream	result;

	if (numElems > 1)
		result << "(";

	for (int i = 0; i < numElems; i++)
	{
		if (i > 0)
			result << ", ";

		if (glu::isDataTypeFloatOrVec(value.type) || glu::isDataTypeMatrix(value.type))
			result << de::floatToString(value.val.floatV[i], 2);
		else if (glu::isDataTypeIntOrIVec((value.type)))
			result << de::toString(value.val.intV[i]);
		else if (glu::isDataTypeBoolOrBVec((value.type)))
			result << (value.val.boolV[i] ? "true" : "false");
		else if (glu::isDataTypeSampler((value.type)))
			result << value.val.samplerV.unit;
		else
			DE_ASSERT(false);
	}

	if (numElems > 1)
		result << ")";

	return result.str();
}